

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

void Wlc_NtkAbsMarkNodes_rec
               (Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Bit_t *vLeaves,Vec_Int_t *vPisOld,
               Vec_Int_t *vPisNew,Vec_Int_t *vFlops)

{
  Wlc_Obj_t WVar1;
  int iVar2;
  int Id;
  Wlc_Obj_t *pObj_00;
  
  if ((char)*(ushort *)pObj < '\0') {
    return;
  }
  *(ushort *)pObj = *(ushort *)pObj | 0x80;
  iVar2 = Vec_BitEntry(vLeaves,(int)(((long)pObj - (long)p->pObjs) / 0x18));
  WVar1 = *pObj;
  if (iVar2 == 0) {
    if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3d) !=
        (undefined1  [24])0x1) {
      for (iVar2 = 0; iVar2 < (int)pObj->nFanins; iVar2 = iVar2 + 1) {
        Id = Wlc_ObjFaninId(pObj,iVar2);
        pObj_00 = Wlc_NtkObj(p,Id);
        Wlc_NtkAbsMarkNodes_rec(p,pObj_00,vLeaves,vPisOld,vPisNew,vFlops);
      }
      return;
    }
    iVar2 = (int)(((long)pObj - (long)p->pObjs) / 0x18);
    vPisNew = vFlops;
    if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3) == (undefined1  [24])0x1
       ) {
      vPisNew = vPisOld;
    }
  }
  else {
    if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x1) {
      __assert_fail("!Wlc_ObjIsPi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                    ,0x6d,
                    "void Wlc_NtkAbsMarkNodes_rec(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Bit_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar2 = (int)(((long)pObj - (long)p->pObjs) / 0x18);
  }
  Vec_IntPush(vPisNew,iVar2);
  return;
}

Assistant:

static void Wlc_NtkAbsMarkNodes_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Bit_t * vLeaves, Vec_Int_t * vPisOld, Vec_Int_t * vPisNew, Vec_Int_t * vFlops )
{
    int i, iFanin;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( Vec_BitEntry(vLeaves, Wlc_ObjId(p, pObj)) )
    {
        assert( !Wlc_ObjIsPi(pObj) );
        Vec_IntPush( vPisNew, Wlc_ObjId(p, pObj) );
        return;
    }
    if ( Wlc_ObjIsCi(pObj) )
    {
        if ( Wlc_ObjIsPi(pObj) )
            Vec_IntPush( vPisOld, Wlc_ObjId(p, pObj) );
        else
            Vec_IntPush( vFlops, Wlc_ObjId(p, pObj) );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkAbsMarkNodes_rec( p, Wlc_NtkObj(p, iFanin), vLeaves, vPisOld, vPisNew, vFlops );
}